

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

void __thiscall wasm::TranslateToFuzzReader::addImportTableSupport(TranslateToFuzzReader *this)

{
  Module *pMVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  char *pcVar5;
  long lVar6;
  Function *pFVar7;
  Name NVar8;
  Signature SVar9;
  Signature SVar10;
  string_view sVar11;
  Type local_60;
  Type local_58;
  HeapType local_50;
  Function *local_48;
  __single_object func;
  HeapType local_38;
  __single_object func_1;
  
  if ((this->funcrefTableName).super_IString.str._M_str != (char *)0x0) {
    pMVar1 = this->wasm;
    pcVar5 = (char *)wasm::IString::interned(5,"table",0);
    NVar8.super_IString.str._M_str = pcVar5;
    NVar8.super_IString.str._M_len = (size_t)pMVar1;
    lVar6 = wasm::Module::getExportOrNull(NVar8);
    if ((lVar6 == 0) && (this->preserveImportsAndExports == false)) {
      pMVar1 = this->wasm;
      sVar11 = (string_view)wasm::IString::interned(5,"table",0);
      local_48 = (Function *)operator_new(0x30);
      pcVar5 = (this->funcrefTableName).super_IString.str._M_str;
      (local_48->super_Importable).module.super_IString.str._M_len =
           (this->funcrefTableName).super_IString.str._M_len;
      (local_48->super_Importable).module.super_IString.str._M_str = pcVar5;
      (local_48->super_Importable).super_Named.name.super_IString.str = sVar11;
      *(undefined4 *)&(local_48->super_Importable).super_Named.hasExplicitName = 1;
      *(undefined1 *)&(local_48->super_Importable).base.super_IString.str._M_len = 0;
      wasm::Module::addExport((unique_ptr *)pMVar1);
      if (local_48 != (Function *)0x0) {
        operator_delete(local_48,0x30);
      }
      pMVar1 = this->wasm;
      NVar8.super_IString.str = (IString)wasm::IString::interned(9,"table-get",0);
      sVar11 = (string_view)Names::getValidFunctionName(pMVar1,NVar8);
      (this->tableGetImportName).super_IString.str = sVar11;
      pFVar7 = (Function *)operator_new(0x1d8);
      memset(pFVar7,0,0x1d8);
      wasm::HeapType::HeapType(&pFVar7->type,(Signature)ZEXT816(0));
      pFVar7->profile = Normal;
      (pFVar7->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pFVar7->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pFVar7->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pFVar7->body = (Expression *)0x0;
      (pFVar7->localNames)._M_h._M_buckets = &(pFVar7->localNames)._M_h._M_single_bucket;
      (pFVar7->localNames)._M_h._M_bucket_count = 1;
      (pFVar7->localNames)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      (pFVar7->localNames)._M_h._M_element_count = 0;
      (pFVar7->localNames)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      (pFVar7->localNames)._M_h._M_rehash_policy._M_next_resize = 0;
      (pFVar7->localNames)._M_h._M_single_bucket = (__node_base_ptr)0x0;
      (pFVar7->localIndices)._M_h._M_buckets = &(pFVar7->localIndices)._M_h._M_single_bucket;
      (pFVar7->localIndices)._M_h._M_bucket_count = 1;
      (pFVar7->localIndices)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      (pFVar7->localIndices)._M_h._M_element_count = 0;
      (pFVar7->localIndices)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      (pFVar7->localIndices)._M_h._M_rehash_policy._M_next_resize = 0;
      (pFVar7->localIndices)._M_h._M_single_bucket = (__node_base_ptr)0x0;
      (pFVar7->debugLocations)._M_h._M_buckets = &(pFVar7->debugLocations)._M_h._M_single_bucket;
      (pFVar7->debugLocations)._M_h._M_bucket_count = 1;
      (pFVar7->debugLocations)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      (pFVar7->debugLocations)._M_h._M_element_count = 0;
      (pFVar7->debugLocations)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      (pFVar7->debugLocations)._M_h._M_rehash_policy._M_next_resize = 0;
      (pFVar7->debugLocations)._M_h._M_single_bucket = (__node_base_ptr)0x0;
      (pFVar7->prologLocation).super__Optional_base<wasm::Function::DebugLocation,_true,_true>.
      _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_engaged = false;
      (pFVar7->epilogLocation).super__Optional_base<wasm::Function::DebugLocation,_true,_true>.
      _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_engaged = false;
      (pFVar7->expressionLocations)._M_h._M_buckets =
           &(pFVar7->expressionLocations)._M_h._M_single_bucket;
      (pFVar7->expressionLocations)._M_h._M_bucket_count = 1;
      (pFVar7->expressionLocations)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      (pFVar7->expressionLocations)._M_h._M_element_count = 0;
      (pFVar7->expressionLocations)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      (pFVar7->expressionLocations)._M_h._M_rehash_policy._M_next_resize = 0;
      (pFVar7->expressionLocations)._M_h._M_single_bucket = (__node_base_ptr)0x0;
      (pFVar7->delimiterLocations)._M_h._M_buckets =
           &(pFVar7->delimiterLocations)._M_h._M_single_bucket;
      (pFVar7->delimiterLocations)._M_h._M_bucket_count = 1;
      (pFVar7->delimiterLocations)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      (pFVar7->delimiterLocations)._M_h._M_element_count = 0;
      (pFVar7->delimiterLocations)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      *(undefined8 *)((long)&(pFVar7->delimiterLocations)._M_h._M_single_bucket + 4) = 0;
      (pFVar7->funcLocation).declarations = 0;
      (pFVar7->funcLocation).end = 0;
      (pFVar7->delimiterLocations)._M_h._M_rehash_policy._M_next_resize = 0;
      (pFVar7->delimiterLocations)._M_h._M_single_bucket = (__node_base_ptr)0x0;
      (pFVar7->effects).super___shared_ptr<wasm::EffectAnalyzer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)0x0;
      (pFVar7->effects).super___shared_ptr<wasm::EffectAnalyzer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      pFVar7->noFullInline = false;
      pFVar7->noPartialInline = false;
      uVar2 = *(undefined4 *)((long)&(this->tableGetImportName).super_IString.str._M_len + 4);
      uVar3 = *(undefined4 *)&(this->tableGetImportName).super_IString.str._M_str;
      uVar4 = *(undefined4 *)((long)&(this->tableGetImportName).super_IString.str._M_str + 4);
      *(int *)&(pFVar7->super_Importable).super_Named.name.super_IString.str._M_len =
           (int)(this->tableGetImportName).super_IString.str._M_len;
      *(undefined4 *)
       ((long)&(pFVar7->super_Importable).super_Named.name.super_IString.str._M_len + 4) = uVar2;
      *(undefined4 *)&(pFVar7->super_Importable).super_Named.name.super_IString.str._M_str = uVar3;
      *(undefined4 *)
       ((long)&(pFVar7->super_Importable).super_Named.name.super_IString.str._M_str + 4) = uVar4;
      local_48 = pFVar7;
      sVar11 = (string_view)wasm::IString::interned(0xf,"fuzzing-support",0);
      (local_48->super_Importable).module.super_IString.str = sVar11;
      sVar11 = (string_view)wasm::IString::interned(9,"table-get",0);
      (local_48->super_Importable).base.super_IString.str = sVar11;
      local_50.id = 2;
      wasm::Type::Type(&local_60,&local_50,1);
      SVar9.results.id = 0x12;
      SVar9.params.id = local_60.id;
      wasm::HeapType::HeapType(&local_38,SVar9);
      (local_48->type).id = local_38.id;
      wasm::Module::addFunction((unique_ptr *)this->wasm);
      if (local_48 != (Function *)0x0) {
        std::default_delete<wasm::Function>::operator()
                  ((default_delete<wasm::Function> *)&local_48,local_48);
      }
      pMVar1 = this->wasm;
      NVar8.super_IString.str = (IString)wasm::IString::interned(9,"table-set",0);
      sVar11 = (string_view)Names::getValidFunctionName(pMVar1,NVar8);
      (this->tableSetImportName).super_IString.str = sVar11;
      pFVar7 = (Function *)operator_new(0x1d8);
      memset(pFVar7,0,0x1d8);
      wasm::HeapType::HeapType(&pFVar7->type,(Signature)ZEXT816(0));
      pFVar7->profile = Normal;
      (pFVar7->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pFVar7->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pFVar7->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pFVar7->body = (Expression *)0x0;
      (pFVar7->localNames)._M_h._M_buckets = &(pFVar7->localNames)._M_h._M_single_bucket;
      (pFVar7->localNames)._M_h._M_bucket_count = 1;
      (pFVar7->localNames)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      (pFVar7->localNames)._M_h._M_element_count = 0;
      (pFVar7->localNames)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      (pFVar7->localNames)._M_h._M_rehash_policy._M_next_resize = 0;
      (pFVar7->localNames)._M_h._M_single_bucket = (__node_base_ptr)0x0;
      (pFVar7->localIndices)._M_h._M_buckets = &(pFVar7->localIndices)._M_h._M_single_bucket;
      (pFVar7->localIndices)._M_h._M_bucket_count = 1;
      (pFVar7->localIndices)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      (pFVar7->localIndices)._M_h._M_element_count = 0;
      (pFVar7->localIndices)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      (pFVar7->localIndices)._M_h._M_rehash_policy._M_next_resize = 0;
      (pFVar7->localIndices)._M_h._M_single_bucket = (__node_base_ptr)0x0;
      (pFVar7->debugLocations)._M_h._M_buckets = &(pFVar7->debugLocations)._M_h._M_single_bucket;
      (pFVar7->debugLocations)._M_h._M_bucket_count = 1;
      (pFVar7->debugLocations)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      (pFVar7->debugLocations)._M_h._M_element_count = 0;
      (pFVar7->debugLocations)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      (pFVar7->debugLocations)._M_h._M_rehash_policy._M_next_resize = 0;
      (pFVar7->debugLocations)._M_h._M_single_bucket = (__node_base_ptr)0x0;
      (pFVar7->prologLocation).super__Optional_base<wasm::Function::DebugLocation,_true,_true>.
      _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_engaged = false;
      (pFVar7->epilogLocation).super__Optional_base<wasm::Function::DebugLocation,_true,_true>.
      _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_engaged = false;
      (pFVar7->expressionLocations)._M_h._M_buckets =
           &(pFVar7->expressionLocations)._M_h._M_single_bucket;
      (pFVar7->expressionLocations)._M_h._M_bucket_count = 1;
      (pFVar7->expressionLocations)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      (pFVar7->expressionLocations)._M_h._M_element_count = 0;
      (pFVar7->expressionLocations)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      (pFVar7->expressionLocations)._M_h._M_rehash_policy._M_next_resize = 0;
      (pFVar7->expressionLocations)._M_h._M_single_bucket = (__node_base_ptr)0x0;
      (pFVar7->delimiterLocations)._M_h._M_buckets =
           &(pFVar7->delimiterLocations)._M_h._M_single_bucket;
      (pFVar7->delimiterLocations)._M_h._M_bucket_count = 1;
      (pFVar7->delimiterLocations)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      (pFVar7->delimiterLocations)._M_h._M_element_count = 0;
      (pFVar7->delimiterLocations)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      *(undefined8 *)((long)&(pFVar7->delimiterLocations)._M_h._M_single_bucket + 4) = 0;
      (pFVar7->funcLocation).declarations = 0;
      (pFVar7->funcLocation).end = 0;
      (pFVar7->delimiterLocations)._M_h._M_rehash_policy._M_next_resize = 0;
      (pFVar7->delimiterLocations)._M_h._M_single_bucket = (__node_base_ptr)0x0;
      (pFVar7->effects).super___shared_ptr<wasm::EffectAnalyzer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)0x0;
      (pFVar7->effects).super___shared_ptr<wasm::EffectAnalyzer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      pFVar7->noFullInline = false;
      pFVar7->noPartialInline = false;
      uVar2 = *(undefined4 *)((long)&(this->tableSetImportName).super_IString.str._M_len + 4);
      uVar3 = *(undefined4 *)&(this->tableSetImportName).super_IString.str._M_str;
      uVar4 = *(undefined4 *)((long)&(this->tableSetImportName).super_IString.str._M_str + 4);
      *(int *)&(pFVar7->super_Importable).super_Named.name.super_IString.str._M_len =
           (int)(this->tableSetImportName).super_IString.str._M_len;
      *(undefined4 *)
       ((long)&(pFVar7->super_Importable).super_Named.name.super_IString.str._M_len + 4) = uVar2;
      *(undefined4 *)&(pFVar7->super_Importable).super_Named.name.super_IString.str._M_str = uVar3;
      *(undefined4 *)
       ((long)&(pFVar7->super_Importable).super_Named.name.super_IString.str._M_str + 4) = uVar4;
      local_38.id = (uintptr_t)pFVar7;
      sVar11 = (string_view)wasm::IString::interned(0xf,"fuzzing-support",0);
      (((Name *)(local_38.id + 0x18))->super_IString).str = sVar11;
      sVar11 = (string_view)wasm::IString::interned(9,"table-set",0);
      (((Name *)(local_38.id + 0x28))->super_IString).str = sVar11;
      local_48 = (Function *)0x2;
      func._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
      super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
           (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
           (__uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>)0x12;
      wasm::Type::Type(&local_58,&local_48,2);
      SVar10.results.id = 0;
      SVar10.params.id = local_58.id;
      wasm::HeapType::HeapType(&local_50,SVar10);
      ((HeapType *)(local_38.id + 0x38))->id = local_50.id;
      wasm::Module::addFunction((unique_ptr *)this->wasm);
      if ((Function *)local_38.id != (Function *)0x0) {
        std::default_delete<wasm::Function>::operator()
                  ((default_delete<wasm::Function> *)&local_38,(Function *)local_38.id);
      }
    }
  }
  return;
}

Assistant:

void TranslateToFuzzReader::addImportTableSupport() {
  // For the table imports to be able to do anything, we must export a table
  // for them. For simplicity, use the funcref table we use internally, though
  // we could pick one at random, support non-funcref ones, and even export
  // multiple ones TODO
  if (!funcrefTableName) {
    return;
  }

  // If a "table" export already exists, skip fuzzing these imports, as the
  // current export may not contain a valid table for it. We also skip if we are
  // not adding imports or exports.
  if (wasm.getExportOrNull("table") || preserveImportsAndExports) {
    return;
  }

  // Export the table.
  wasm.addExport(
    builder.makeExport("table", funcrefTableName, ExternalKind::Table));

  // Get from the table.
  {
    tableGetImportName = Names::getValidFunctionName(wasm, "table-get");
    auto func = std::make_unique<Function>();
    func->name = tableGetImportName;
    func->module = "fuzzing-support";
    func->base = "table-get";
    func->type = Signature({Type::i32}, Type(HeapType::func, Nullable));
    wasm.addFunction(std::move(func));
  }

  // Set into the table.
  {
    tableSetImportName = Names::getValidFunctionName(wasm, "table-set");
    auto func = std::make_unique<Function>();
    func->name = tableSetImportName;
    func->module = "fuzzing-support";
    func->base = "table-set";
    func->type =
      Signature({Type::i32, Type(HeapType::func, Nullable)}, Type::none);
    wasm.addFunction(std::move(func));
  }
}